

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

void __thiscall sf::Texture::setSmooth(Texture *this,bool smooth)

{
  uint uVar1;
  TransientContextLock lock;
  TextureSaver save;
  TransientContextLock local_15;
  TextureSaver local_14;
  
  if ((this->m_isSmooth != smooth) && (this->m_isSmooth = smooth, this->m_texture != 0)) {
    GlResource::TransientContextLock::TransientContextLock(&local_15);
    priv::TextureSaver::TextureSaver(&local_14);
    (*sf_glad_glBindTexture)(0xde1,this->m_texture);
    (*sf_glad_glTexParameteri)(0xde1,0x2800,this->m_isSmooth | 0x2600);
    uVar1 = 0x2600;
    if (this->m_hasMipmap != false) {
      uVar1 = 0x2702;
    }
    (*sf_glad_glTexParameteri)(0xde1,0x2801,uVar1 | this->m_isSmooth);
    priv::TextureSaver::~TextureSaver(&local_14);
    GlResource::TransientContextLock::~TransientContextLock(&local_15);
  }
  return;
}

Assistant:

void Texture::setSmooth(bool smooth)
{
    if (smooth != m_isSmooth)
    {
        m_isSmooth = smooth;

        if (m_texture)
        {
            TransientContextLock lock;

            // Make sure that the current texture binding will be preserved
            priv::TextureSaver save;

            glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));

            if (m_hasMipmap)
            {
                glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR_MIPMAP_LINEAR : GL_NEAREST_MIPMAP_LINEAR));
            }
            else
            {
                glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
            }
        }
    }
}